

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_dnd_x.cxx
# Opt level: O0

int dnd_aware(Window *window)

{
  int local_4c;
  undefined8 *puStack_48;
  int ret;
  uchar *data;
  unsigned_long remaining;
  unsigned_long count;
  long lStack_28;
  int format;
  Atom actual;
  Window *window_local;
  
  puStack_48 = (undefined8 *)0x0;
  actual = (Atom)window;
  XGetWindowProperty(fl_display,*window,fl_XdndAware,0,4,0,4,&stack0xffffffffffffffd8,
                     (long)&count + 4,&remaining,&data,&stack0xffffffffffffffb8);
  local_4c = 0;
  if ((((lStack_28 == 4) && (count._4_4_ == 0x20)) && (remaining != 0)) &&
     (puStack_48 != (undefined8 *)0x0)) {
    local_4c = (int)*puStack_48;
  }
  if (puStack_48 != (undefined8 *)0x0) {
    XFree(puStack_48);
  }
  return local_4c;
}

Assistant:

static int dnd_aware(Window& window) {
  Atom actual; int format; unsigned long count, remaining;
  unsigned char *data = 0;
  XGetWindowProperty(fl_display, window, fl_XdndAware,
		     0, 4, False, XA_ATOM,
		     &actual, &format,
		     &count, &remaining, &data);
  int ret = 0;
  if (actual == XA_ATOM && format==32 && count && data)
    ret = int(*(Atom*)data);
  if (data) { XFree(data); data = 0; }
  return ret;
}